

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeNode.h
# Opt level: O0

void __thiscall
TreeNode<JointObservationHistory>::~TreeNode(TreeNode<JointObservationHistory> *this)

{
  bool bVar1;
  pointer ppVar2;
  undefined8 *in_RDI;
  map<unsigned_long_long,_TreeNode<JointObservationHistory>_*,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_TreeNode<JointObservationHistory>_*>_>_>
  *in_stack_ffffffffffffffb8;
  iterator in_stack_ffffffffffffffc0;
  iterator __position;
  
  *in_RDI = &PTR__TreeNode_00d32da0;
  if ((long *)in_RDI[10] != (long *)0x0) {
    (**(code **)(*(long *)in_RDI[10] + 8))();
  }
  while (bVar1 = std::
                 map<unsigned_long_long,_TreeNode<JointObservationHistory>_*,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_TreeNode<JointObservationHistory>_*>_>_>
                 ::empty((map<unsigned_long_long,_TreeNode<JointObservationHistory>_*,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_TreeNode<JointObservationHistory>_*>_>_>
                          *)0x9e1f6b), ((bVar1 ^ 0xffU) & 1) != 0) {
    std::
    map<unsigned_long_long,_TreeNode<JointObservationHistory>_*,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_TreeNode<JointObservationHistory>_*>_>_>
    ::begin(in_stack_ffffffffffffffb8);
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_long_long,_TreeNode<JointObservationHistory>_*>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_long_long,_TreeNode<JointObservationHistory>_*>_>
                           *)in_stack_ffffffffffffffc0._M_node);
    __position._M_node = (_Base_ptr)ppVar2->second;
    if ((TreeNode<JointObservationHistory> *)__position._M_node !=
        (TreeNode<JointObservationHistory> *)0x0) {
      (*((TreeNode<JointObservationHistory> *)__position._M_node)->_vptr_TreeNode[1])();
    }
    in_stack_ffffffffffffffb8 =
         (map<unsigned_long_long,_TreeNode<JointObservationHistory>_*,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_TreeNode<JointObservationHistory>_*>_>_>
          *)(in_RDI + 1);
    std::
    map<unsigned_long_long,_TreeNode<JointObservationHistory>_*,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_TreeNode<JointObservationHistory>_*>_>_>
    ::begin(in_stack_ffffffffffffffb8);
    in_stack_ffffffffffffffc0 =
         std::
         map<unsigned_long_long,TreeNode<JointObservationHistory>*,std::less<unsigned_long_long>,std::allocator<std::pair<unsigned_long_long_const,TreeNode<JointObservationHistory>*>>>
         ::erase_abi_cxx11_(in_stack_ffffffffffffffc0._M_node,__position);
  }
  std::
  map<unsigned_long_long,_TreeNode<JointObservationHistory>_*,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_TreeNode<JointObservationHistory>_*>_>_>
  ::~map((map<unsigned_long_long,_TreeNode<JointObservationHistory>_*,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_TreeNode<JointObservationHistory>_*>_>_>
          *)0x9e1ff3);
  return;
}

Assistant:

virtual ~TreeNode()
        {
#if DEBUG_TREENODE
            cerr << "Deleting TreeNode. This node ";
            PrintThisNode();cerr << endl;
#endif
            delete(_m_containedElem);

            while(!_m_successor.empty())
            {
                delete _m_successor.begin()->second; // recursively
                                                     // delete the
                                                     // rest of the
                                                     // tree
                _m_successor.erase(_m_successor.begin());
            }
        }